

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O0

XrResult ApiDumpLayerXrSetInputDeviceActiveEXT
                   (XrSession session,XrPath interactionProfile,XrPath topLevelPath,
                   XrBool32 isActive)

{
  bool bVar1;
  pointer ppVar2;
  ostream *poVar3;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8 [32];
  ostringstream local_3d8 [8];
  ostringstream oss_isActive;
  __cxx11 local_260 [32];
  __cxx11 local_240 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220 [32];
  ostringstream local_200 [8];
  ostringstream oss_session;
  _Node_iterator_base<std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>,_false> local_80;
  _Node_iterator_base<std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>,_false> local_78;
  iterator map_iter;
  undefined1 local_60 [8];
  unique_lock<std::mutex> mlock;
  XrGeneratedDispatchTable *gen_dispatch_table;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  XrResult result;
  XrBool32 isActive_local;
  XrPath topLevelPath_local;
  XrPath interactionProfile_local;
  XrSession session_local;
  
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = XR_SUCCESS;
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = isActive;
  interactionProfile_local = (XrPath)session;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&gen_dispatch_table);
  mlock._M_owns = false;
  mlock._9_7_ = 0;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_60,&g_session_dispatch_mutex);
  local_78._M_cur =
       (__node_type *)
       std::
       unordered_map<XrSession_T_*,_XrGeneratedDispatchTable_*,_std::hash<XrSession_T_*>,_std::equal_to<XrSession_T_*>,_std::allocator<std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>_>_>
       ::find(&g_session_dispatch_map,(key_type *)&interactionProfile_local);
  local_80._M_cur =
       (__node_type *)
       std::
       unordered_map<XrSession_T_*,_XrGeneratedDispatchTable_*,_std::hash<XrSession_T_*>,_std::equal_to<XrSession_T_*>,_std::allocator<std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>_>_>
       ::end(&g_session_dispatch_map);
  bVar1 = std::__detail::operator==(&local_78,&local_80);
  if (bVar1) {
    session_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>,_false,_false>
             ::operator->((_Node_iterator<std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>,_false,_false>
                           *)&local_78);
    mlock._8_8_ = ppVar2->second;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_60);
  if (!bVar1) {
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[26],char_const(&)[1]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&gen_dispatch_table,(char (*) [9])"XrResult",
               (char (*) [26])"xrSetInputDeviceActiveEXT",(char (*) [1])0x2ffb54);
    std::__cxx11::ostringstream::ostringstream(local_200);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_200,std::hex);
    std::ostream::operator<<(poVar3,(void *)interactionProfile_local);
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[10],char_const(&)[8],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&gen_dispatch_table,(char (*) [10])"XrSession",(char (*) [8])"session",local_220);
    std::__cxx11::string::~string((string *)local_220);
    std::__cxx11::to_string(local_240,interactionProfile);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[7],char_const(&)[19],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&gen_dispatch_table,(char (*) [7])"XrPath",(char (*) [19])"interactionProfile",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240);
    std::__cxx11::string::~string((string *)local_240);
    std::__cxx11::to_string(local_260,topLevelPath);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[7],char_const(&)[13],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&gen_dispatch_table,(char (*) [7])"XrPath",(char (*) [13])"topLevelPath",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
    std::__cxx11::string::~string((string *)local_260);
    std::__cxx11::ostringstream::ostringstream(local_3d8);
    poVar3 = std::operator<<((ostream *)local_3d8,"0x");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
    std::ostream::operator<<
              (poVar3,contents.
                      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[9],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&gen_dispatch_table,(char (*) [9])"XrBool32",(char (*) [9])"isActive",local_3f8);
    std::__cxx11::string::~string((string *)local_3f8);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_410,
             (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&gen_dispatch_table);
    ApiDumpLayerRecordContent(&local_410);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_410);
    contents.
    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         (**(code **)(mlock._8_8_ + 600))
                   (interactionProfile_local,interactionProfile,topLevelPath,
                    contents.
                    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    std::__cxx11::ostringstream::~ostringstream(local_3d8);
    std::__cxx11::ostringstream::~ostringstream(local_200);
    bVar1 = false;
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&gen_dispatch_table);
  if (bVar1 == false) {
    session_local._4_4_ =
         (XrResult)
         contents.
         super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  return session_local._4_4_;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrSetInputDeviceActiveEXT(
    XrSession session,
    XrPath interactionProfile,
    XrPath topLevelPath,
    XrBool32 isActive) {
    XrResult result = XR_SUCCESS;
    try {
        // Generate output for this command
        std::vector<std::tuple<std::string, std::string, std::string>> contents;
        XrGeneratedDispatchTable *gen_dispatch_table = nullptr;

        {
            std::unique_lock<std::mutex> mlock(g_session_dispatch_mutex);
            auto map_iter = g_session_dispatch_map.find(session);
            if (map_iter == g_session_dispatch_map.end()) {
                return XR_ERROR_VALIDATION_FAILURE;
            }
            gen_dispatch_table = map_iter->second;
        }

        contents.emplace_back("XrResult", "xrSetInputDeviceActiveEXT", "");
        std::ostringstream oss_session;
        oss_session << std::hex << reinterpret_cast<const void*>(session);
        contents.emplace_back("XrSession", "session", oss_session.str());
        contents.emplace_back("XrPath", "interactionProfile", std::to_string(interactionProfile));
        contents.emplace_back("XrPath", "topLevelPath", std::to_string(topLevelPath));
        std::ostringstream oss_isActive;
        oss_isActive << "0x" << std::hex << (isActive);
        contents.emplace_back("XrBool32", "isActive", oss_isActive.str());
        ApiDumpLayerRecordContent(contents);

        result = gen_dispatch_table->SetInputDeviceActiveEXT(session, interactionProfile, topLevelPath, isActive);
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}